

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strings.c
# Opt level: O1

void test_sbs_strcat(CuTest *tc)

{
  char buffer [8];
  sbstring sbs;
  char local_50 [8];
  sbstring local_48;
  
  sbs_init(&local_48,local_50,8);
  sbs_strcat(&local_48,"AB");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x114,(char *)0x0,"AB",local_48.begin);
  sbs_strcat(&local_48,(char *)0x0);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x116,(char *)0x0,"AB",local_48.begin);
  sbs_strcat(&local_48,"CD");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x118,(char *)0x0,"ABCD",local_48.begin);
  sbs_init(&local_48,local_50,8);
  sbs_strcat(&local_48,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x11c,(char *)0x0,"1234567",local_48.begin);
  sbs_strcat(&local_48,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x11e,(char *)0x0,"1234567",local_48.begin);
  sbs_init(&local_48,local_50,8);
  sbs_strncat(&local_48,"12345678901234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x122,(char *)0x0,"1234",local_48.begin);
  sbs_strncat(&local_48,(char *)0x0,4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x124,(char *)0x0,"1234",local_48.begin);
  sbs_strncat(&local_48,"12345678901234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x126,(char *)0x0,"1234123",local_48.begin);
  return;
}

Assistant:

static void test_sbs_strcat(CuTest * tc)
{
    char buffer[8];
    sbstring sbs;

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "AB");
    CuAssertStrEquals(tc, "AB", sbs.begin);
    sbs_strcat(&sbs, NULL);
    CuAssertStrEquals(tc, "AB", sbs.begin);
    sbs_strcat(&sbs, "CD");
    CuAssertStrEquals(tc, "ABCD", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "1234567", sbs.begin);
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "1234567", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strncat(&sbs, "12345678901234567890", 4);
    CuAssertStrEquals(tc, "1234", sbs.begin);
    sbs_strncat(&sbs, NULL, 4);
    CuAssertStrEquals(tc, "1234", sbs.begin);
    sbs_strncat(&sbs, "12345678901234567890", 4);
    CuAssertStrEquals(tc, "1234123", sbs.begin);
}